

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O3

void __thiscall
duckdb::TopNHeap::AddSmallHeap(TopNHeap *this,DataChunk *input,Vector *sort_keys_vec)

{
  undefined8 *puVar1;
  data_ptr_t pdVar2;
  anon_union_16_2_67f50693_for_value *paVar3;
  char *pcVar4;
  vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>> *this_00;
  DataChunk *pDVar5;
  TopNHeap *pTVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  pointer pTVar10;
  ulong uVar11;
  string_t *psVar12;
  iterator __position;
  TopNEntry *entry_1;
  ulong uVar13;
  anon_union_16_2_67f50693_for_value *data;
  ulong uVar14;
  ulong uVar15;
  idx_t sel_count;
  anon_struct_16_3_d7536bce_for_pointer aVar16;
  TopNEntry entry;
  anon_union_16_2_67f50693_for_value local_78;
  idx_t local_68;
  DataChunk *local_60;
  TopNHeap *local_58;
  vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>> *local_50;
  anon_union_16_2_67f50693_for_value local_48;
  idx_t local_38;
  
  if (input->count != 0) {
    pdVar2 = sort_keys_vec->data;
    local_50 = (vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>> *)&this->heap;
    bVar8 = false;
    uVar13 = 0;
    do {
      this_00 = local_50;
      psVar12 = (string_t *)(pdVar2 + uVar13 * 0x10);
      while( true ) {
        pTVar10 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                  super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                  super__Vector_impl_data._M_start;
        __position._M_current =
             (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
             super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
        lVar9 = (long)__position._M_current - (long)pTVar10;
        uVar11 = (lVar9 >> 3) * -0x5555555555555555;
        uVar15 = this->heap_size;
        if (uVar11 < uVar15) break;
        bVar7 = string_t::StringComparisonOperators::GreaterThan(&pTVar10->sort_key,psVar12);
        if (bVar7) {
          pTVar10 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>
                    .super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          __position._M_current =
               (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
               super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
               super__Vector_impl_data._M_finish;
          uVar15 = this->heap_size;
          lVar9 = (long)__position._M_current - (long)pTVar10;
          uVar11 = (lVar9 >> 3) * -0x5555555555555555;
          break;
        }
        uVar13 = uVar13 + 1;
        psVar12 = psVar12 + 1;
        if (input->count <= uVar13) {
          if (!bVar8) {
            return;
          }
          goto LAB_01561847;
        }
      }
      local_48._0_8_ = *(undefined8 *)&psVar12->value;
      local_48.pointer.ptr = (psVar12->value).pointer.ptr;
      local_38 = uVar13 + 0xffffffff;
      if (uVar15 <= uVar11) {
        if (0x18 < lVar9) {
          local_68 = __position._M_current[-1].index;
          local_78._0_8_ = *(undefined8 *)&__position._M_current[-1].sort_key.value;
          local_78.pointer.ptr = __position._M_current[-1].sort_key.value.pointer.ptr;
          pcVar4 = (pTVar10->sort_key).value.pointer.ptr;
          *(undefined8 *)&__position._M_current[-1].sort_key.value =
               *(undefined8 *)&(pTVar10->sort_key).value;
          __position._M_current[-1].sort_key.value.pointer.ptr = pcVar4;
          __position._M_current[-1].index = pTVar10->index;
          ::std::
          __adjust_heap<__gnu_cxx::__normal_iterator<duckdb::TopNEntry*,std::vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>>>,long,duckdb::TopNEntry,__gnu_cxx::__ops::_Iter_less_iter>
                    (pTVar10,0,
                     ((long)__position._M_current + (-0x18 - (long)pTVar10) >> 3) *
                     -0x5555555555555555);
          __position._M_current =
               (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
               super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
               super__Vector_impl_data._M_finish;
        }
        __position._M_current = __position._M_current + -1;
        (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
        super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current;
      }
      if (__position._M_current ==
          (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
          super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>>::
        _M_realloc_insert<duckdb::TopNEntry_const&>
                  (this_00,__position,(TopNEntry *)&local_48.pointer);
        pTVar10 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                  super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      else {
        (__position._M_current)->index = local_38;
        *(undefined8 *)&((__position._M_current)->sort_key).value = local_48._0_8_;
        ((__position._M_current)->sort_key).value.pointer.ptr = local_48.pointer.ptr;
        pTVar10 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                  super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
        (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
        super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
        super__Vector_impl_data._M_finish = pTVar10;
      }
      lVar9 = *(long *)this_00;
      local_68 = pTVar10[-1].index;
      local_78._0_8_ = *(undefined8 *)&pTVar10[-1].sort_key.value;
      local_78.pointer.ptr = pTVar10[-1].sort_key.value.pointer.ptr;
      uVar15 = ((long)pTVar10 - lVar9 >> 3) * -0x5555555555555555 - 1;
      pDVar5 = input;
      pTVar6 = this;
      if (0x18 < (long)pTVar10 - lVar9) {
        do {
          local_58 = pTVar6;
          local_60 = pDVar5;
          uVar11 = uVar15 - 1;
          uVar14 = uVar11 >> 1;
          psVar12 = (string_t *)(uVar14 * 0x18 + lVar9);
          bVar8 = string_t::StringComparisonOperators::GreaterThan
                            ((string_t *)&local_78.pointer,psVar12);
          this = local_58;
          input = local_60;
          if (!bVar8) goto LAB_0156180d;
          *(undefined8 *)(lVar9 + 0x10 + uVar15 * 0x18) = *(undefined8 *)&psVar12[1].value;
          pcVar4 = (psVar12->value).pointer.ptr;
          puVar1 = (undefined8 *)(lVar9 + uVar15 * 0x18);
          *puVar1 = *(undefined8 *)&psVar12->value;
          puVar1[1] = pcVar4;
          uVar15 = uVar14;
          pDVar5 = local_60;
          pTVar6 = local_58;
        } while (1 < uVar11);
        uVar15 = 0;
      }
LAB_0156180d:
      *(idx_t *)(lVar9 + 0x10 + uVar15 * 0x18) = local_68;
      puVar1 = (undefined8 *)(lVar9 + uVar15 * 0x18);
      *puVar1 = local_78._0_8_;
      puVar1[1] = local_78.pointer.ptr;
      uVar13 = uVar13 + 1;
      bVar8 = true;
    } while (uVar13 < input->count);
LAB_01561847:
    data = (anon_union_16_2_67f50693_for_value *)
           (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
           super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
           super__Vector_impl_data._M_start;
    paVar3 = (anon_union_16_2_67f50693_for_value *)
             (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
             super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (data == paVar3) {
      sel_count = 0;
    }
    else {
      sel_count = 0;
      do {
        uVar13 = *(ulong *)(data + 1);
        if (0xfffffffe < uVar13) {
          if (0xc < (((string_t *)&(data->pointer).length)->value).pointer.length) {
            aVar16 = (anon_struct_16_3_d7536bce_for_pointer)
                     StringHeap::AddBlob(&this->sort_key_heap,(string_t *)&data->pointer);
            data->pointer = aVar16;
            uVar13 = *(ulong *)(data + 1);
          }
          (this->matching_sel).sel_vector[sel_count] = (int)uVar13 + 1;
          *(idx_t *)(data + 1) = (this->heap_data).count + sel_count;
          sel_count = sel_count + 1;
        }
        data = (anon_union_16_2_67f50693_for_value *)((long)data + 0x18);
      } while (data != paVar3);
    }
    DataChunk::Append(&this->heap_data,input,true,&this->matching_sel,sel_count);
  }
  return;
}

Assistant:

void TopNHeap::AddSmallHeap(DataChunk &input, Vector &sort_keys_vec) {
	// insert the sort keys into the priority queue
	constexpr idx_t BASE_INDEX = NumericLimits<uint32_t>::Maximum();

	bool any_added = false;
	auto sort_key_values = FlatVector::GetData<string_t>(sort_keys_vec);
	for (idx_t r = 0; r < input.size(); r++) {
		auto &sort_key = sort_key_values[r];
		if (!EntryShouldBeAdded(sort_key)) {
			continue;
		}
		// replace the previous top entry with the new entry
		TopNEntry entry;
		entry.sort_key = sort_key;
		entry.index = BASE_INDEX + r;
		AddEntryToHeap(entry);
		any_added = true;
	}
	if (!any_added) {
		// early-out: no matches
		return;
	}

	// for all matching entries we need to copy over the corresponding payload values
	idx_t match_count = 0;
	for (auto &entry : heap) {
		if (entry.index < BASE_INDEX) {
			continue;
		}
		// this entry was added in this chunk
		// if not inlined - copy over the string to the string heap
		if (!entry.sort_key.IsInlined()) {
			entry.sort_key = sort_key_heap.AddBlob(entry.sort_key);
		}
		// to finalize the addition of this entry we need to move over the payload data
		matching_sel.set_index(match_count, entry.index - BASE_INDEX);
		entry.index = heap_data.size() + match_count;
		match_count++;
	}

	// copy over the input rows to the payload chunk
	heap_data.Append(input, true, &matching_sel, match_count);
}